

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O3

bool __thiscall
covenant::CycleBreaking<covenant::Sym>::isLLRule
          (CycleBreaking<covenant::Sym> *this,CFG *g,uint lhs,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *rhs,
          set<int,_std::less<int>,_std::allocator<int>_> *scc)

{
  pointer pSVar1;
  bool bVar2;
  pointer s;
  pointer s_00;
  
  s = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
      super__Vector_impl_data._M_start;
  pSVar1 = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (s != pSVar1) {
    s_00 = s + 1;
    if (s_00 != pSVar1) {
      do {
        bVar2 = isTerminal(this,s_00,scc);
        if (!bVar2) {
          return false;
        }
        s_00 = s_00 + 1;
      } while (s_00 != pSVar1);
      s = (rhs->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
          super__Vector_impl_data._M_start;
    }
    if (s->x != lhs * 2 + 1) {
      bVar2 = isTerminal(this,s,scc);
      return bVar2;
    }
  }
  return true;
}

Assistant:

bool isLLRule (const CFG &g, unsigned int lhs, const vector<EdgeSym> &rhs, 
                 const set<int> &scc)
  {
    if (rhs.empty()) 
      return true;
    if (allTerminal(rhs.begin()+1, rhs.end(), scc))
      return ((rhs[0] == EdgeSym::mkVar(lhs)) || isTerminal(rhs[0],scc));
    else
      return false;
  }